

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O0

DecodeStatus DecodeMSA128Mem(MCInst *Inst,uint Insn,uint64_t Address,MCRegisterInfo *Decoder)

{
  uint32_t X;
  int32_t iVar1;
  uint uVar2;
  uint32_t in_ESI;
  MCInst *in_RDI;
  uint Base;
  uint Reg;
  int Offset;
  uint in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  uint uVar3;
  uint numBits;
  
  uVar3 = 10;
  X = fieldFromInstruction(in_ESI,0x10,10);
  iVar1 = SignExtend32(X,uVar3);
  numBits = 5;
  fieldFromInstruction(in_ESI,6,5);
  fieldFromInstruction(in_ESI,0xb,numBits);
  uVar2 = getReg((MCRegisterInfo *)CONCAT44(numBits,uVar3),in_stack_ffffffffffffffbc,
                 in_stack_ffffffffffffffb8);
  uVar3 = getReg((MCRegisterInfo *)CONCAT44(numBits,uVar3),in_stack_ffffffffffffffbc,
                 in_stack_ffffffffffffffb8);
  MCOperand_CreateReg0(in_RDI,uVar2);
  MCOperand_CreateReg0(in_RDI,uVar3);
  uVar2 = MCInst_getOpcode(in_RDI);
  if (uVar2 == 0x3b1) {
LAB_0030553a:
    MCOperand_CreateImm0(in_RDI,(long)iVar1);
  }
  else {
    if (uVar2 == 0x3b2) {
LAB_00305576:
      MCOperand_CreateImm0(in_RDI,(long)(iVar1 << 3));
      return MCDisassembler_Success;
    }
    if (uVar2 == 0x3b3) {
LAB_0030554b:
      MCOperand_CreateImm0(in_RDI,(long)(iVar1 << 1));
      return MCDisassembler_Success;
    }
    if (uVar2 != 0x3b4) {
      if (uVar2 == 0x63a) goto LAB_0030553a;
      if (uVar2 == 0x63b) goto LAB_00305576;
      if (uVar2 == 0x63c) goto LAB_0030554b;
      if (uVar2 != 0x63d) {
        return MCDisassembler_Fail;
      }
    }
    MCOperand_CreateImm0(in_RDI,(long)(iVar1 << 2));
  }
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeMSA128Mem(MCInst *Inst, unsigned Insn,
		uint64_t Address, const MCRegisterInfo *Decoder)
{
	int Offset = SignExtend32(fieldFromInstruction(Insn, 16, 10), 10);
	unsigned Reg = fieldFromInstruction(Insn, 6, 5);
	unsigned Base = fieldFromInstruction(Insn, 11, 5);

	Reg = getReg(Decoder, Mips_MSA128BRegClassID, Reg);
	Base = getReg(Decoder, Mips_GPR32RegClassID, Base);

	MCOperand_CreateReg0(Inst, Reg);
	MCOperand_CreateReg0(Inst, Base);
	// MCOperand_CreateImm0(Inst, Offset);

	// The immediate field of an LD/ST instruction is scaled which means it must
	// be multiplied (when decoding) by the size (in bytes) of the instructions'
	// data format.
	// .b - 1 byte
	// .h - 2 bytes
	// .w - 4 bytes
	// .d - 8 bytes
	switch(MCInst_getOpcode(Inst)) {
		default:
			//assert (0 && "Unexpected instruction");
			return MCDisassembler_Fail;
			break;
		case Mips_LD_B:
		case Mips_ST_B:
			MCOperand_CreateImm0(Inst, Offset);
			break;
		case Mips_LD_H:
		case Mips_ST_H:
			MCOperand_CreateImm0(Inst, Offset * 2);
			break;
		case Mips_LD_W:
		case Mips_ST_W:
			MCOperand_CreateImm0(Inst, Offset * 4);
			break;
		case Mips_LD_D:
		case Mips_ST_D:
			MCOperand_CreateImm0(Inst, Offset * 8);
			break;
	}

	return MCDisassembler_Success;
}